

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::EndTabItem(void)

{
  ImGuiTabBar *this;
  ImGuiTabItem *pIVar1;
  
  if (GImGui->CurrentWindow->SkipItems == false) {
    this = GImGui->CurrentTabBar;
    if (this == (ImGuiTabBar *)0x0) {
      __assert_fail("(tab_bar != __null) && \"Needs to be called between BeginTabBar() and EndTabBar()!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                    ,0x1d9a,"void ImGui::EndTabItem()");
    }
    if (this->LastTabItemIdx < 0) {
      __assert_fail("tab_bar->LastTabItemIdx >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                    ,0x1d9d,"void ImGui::EndTabItem()");
    }
    pIVar1 = ImVector<ImGuiTabItem>::operator[](&this->Tabs,(int)this->LastTabItemIdx);
    if ((pIVar1->Flags & 8) == 0) {
      PopID();
      return;
    }
  }
  return;
}

Assistant:

void    ImGui::EndTabItem()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTabBar* tab_bar = g.CurrentTabBar;
    if (tab_bar == NULL)
    {
        IM_ASSERT_USER_ERROR(tab_bar != NULL, "Needs to be called between BeginTabBar() and EndTabBar()!");
        return;
    }
    IM_ASSERT(tab_bar->LastTabItemIdx >= 0);
    ImGuiTabItem* tab = &tab_bar->Tabs[tab_bar->LastTabItemIdx];
    if (!(tab->Flags & ImGuiTabItemFlags_NoPushId))
        PopID();
}